

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  char *in_RCX;
  char *in_RDX;
  long *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  float unaff_retaddr;
  undefined1 unaff_retaddr_00;
  longlong in_stack_00000008;
  longlong in_stack_00000010;
  float in_stack_00000018;
  ImGuiDataType in_stack_0000001c;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  longlong v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  float in_stack_ffffffffffffff6c;
  char *local_68;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  ImVec2 in_stack_ffffffffffffffa8;
  float local_4c;
  undefined4 in_stack_ffffffffffffffc8;
  ImGuiDataType data_type_00;
  undefined4 in_stack_ffffffffffffffe8;
  float in_stack_fffffffffffffffc;
  bool bVar10;
  
  pIVar1 = GImGui;
  data_type_00 = (ImGuiDataType)((ulong)in_R8 >> 0x20);
  uVar3 = (uint)((in_R9D & 0x100000) != 0);
  bVar10 = (long)in_RDX < (long)in_RCX;
  bVar5 = (in_R9D & 0x20) != 0;
  bVar6 = in_EDI != 8;
  bVar7 = in_EDI != 9;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (bVar10)) &&
     ((float)((long)in_RCX - (long)in_RDX) < 3.4028235e+38)) {
    in_XMM0_Da = (float)((long)in_RCX - (long)in_RDX) * GImGui->DragSpeedDefaultRatio;
  }
  local_4c = 0.0;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)0x0), bVar2)) &&
     (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), bVar2)) {
    pfVar4 = ImVec2::operator[](&(pIVar1->IO).MouseDelta,(long)(int)uVar3);
    local_4c = *pfVar4;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      local_4c = local_4c * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      local_4c = local_4c * 10.0;
    }
  }
  else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if (!bVar6 || !bVar7) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                  CONCAT13(in_stack_ffffffffffffff6b,
                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                    CONCAT11(in_stack_ffffffffffffff69,
                                                             in_stack_ffffffffffffff68)))),
                 in_stack_ffffffffffffff64);
    }
    in_stack_ffffffffffffff6c = in_XMM0_Da;
    GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_ffffffffffffffa8.y,
                        (ImGuiInputReadMode)in_stack_ffffffffffffffa8.x,in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffffa0);
    pfVar4 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffa8,(long)(int)uVar3);
    local_4c = *pfVar4;
    fVar8 = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff60);
    in_XMM0_Da = ImMax<float>(in_stack_ffffffffffffff6c,fVar8);
  }
  local_4c = in_XMM0_Da * local_4c;
  if (uVar3 == 1) {
    local_4c = -local_4c;
  }
  if (((bVar5) && ((float)((long)in_RCX - (long)in_RDX) < 3.4028235e+38)) &&
     (1e-06 < (float)((long)in_RCX - (long)in_RDX))) {
    local_4c = local_4c / (float)((long)in_RCX - (long)in_RDX);
  }
  bVar2 = false;
  if ((bVar10) &&
     ((*in_RSI < (long)in_RCX || (in_stack_ffffffffffffff6a = true, bVar2 = true, local_4c <= 0.0)))
     ) {
    in_stack_ffffffffffffff69 = *in_RSI <= (long)in_RDX && local_4c < 0.0;
    in_stack_ffffffffffffff6a = in_stack_ffffffffffffff69;
    bVar2 = (bool)in_stack_ffffffffffffff69;
  }
  if (((pIVar1->ActiveIdIsJustActivated & 1U) == 0) && (bVar2 == false)) {
    if ((local_4c != 0.0) || (NAN(local_4c))) {
      pIVar1->DragCurrentAccum = local_4c + pIVar1->DragCurrentAccum;
      pIVar1->DragCurrentAccumDirty = true;
    }
  }
  else {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    bVar10 = false;
  }
  else {
    fVar8 = 0.0;
    if (bVar5) {
      if (!bVar6 || !bVar7) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                    CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffff6a,
                                                            CONCAT11(in_stack_ffffffffffffff69,
                                                                     in_stack_ffffffffffffff68)))),
                   in_stack_ffffffffffffff64);
      }
      ImPow(0.0,2.556886e-39);
      fVar8 = ScaleRatioFromValueT<long_long,long_long,double>
                        ((ImGuiDataType)unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (longlong)in_RSI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_RDX >> 0x38,0),SUB84(in_RDX,0),
                         (float)((ulong)in_RCX >> 0x20));
      local_68 = (char *)ScaleValueFromRatioT<long_long,long_long,double>
                                   (in_stack_0000001c,in_stack_00000018,in_stack_00000010,
                                    in_stack_00000008,(bool)unaff_retaddr_00,unaff_retaddr,
                                    in_stack_fffffffffffffffc);
    }
    else {
      local_68 = (char *)((long)pIVar1->DragCurrentAccum + *in_RSI);
    }
    if ((in_R9D & 0x40) == 0) {
      local_68 = (char *)RoundScalarWithFormatT<long_long,long_long>
                                   (in_RCX,data_type_00,CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
    }
    pIVar1->DragCurrentAccumDirty = false;
    if (bVar5) {
      fVar9 = ScaleRatioFromValueT<long_long,long_long,double>
                        ((ImGuiDataType)unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (longlong)in_RSI,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_RDX >> 0x38,0),SUB84(in_RDX,0),
                         (float)((ulong)in_RCX >> 0x20));
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (fVar9 - fVar8);
    }
    else {
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)((long)local_68 - *in_RSI);
    }
    if (local_68 == (char *)0x0) {
      local_68 = (char *)0x0;
    }
    if (((char *)*in_RSI != local_68) && (bVar10)) {
      if (((long)local_68 < (long)in_RDX) ||
         (((*in_RSI < (long)local_68 && (local_4c < 0.0)) && (bVar6 && bVar7)))) {
        local_68 = in_RDX;
      }
      if (((long)in_RCX < (long)local_68) ||
         ((((long)local_68 < *in_RSI && (0.0 < local_4c)) && (bVar6 && bVar7)))) {
        local_68 = in_RCX;
      }
    }
    if ((char *)*in_RSI == local_68) {
      bVar10 = false;
    }
    else {
      *in_RSI = (long)local_68;
      bVar10 = true;
    }
  }
  return bVar10;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}